

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleARGBColsUp2_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  undefined4 uVar1;
  int iVar2;
  
  if (1 < dst_width) {
    iVar2 = 0;
    do {
      uVar1 = *(undefined4 *)src_argb;
      *(undefined4 *)dst_argb = uVar1;
      *(undefined4 *)(dst_argb + 4) = uVar1;
      src_argb = src_argb + 4;
      dst_argb = dst_argb + 8;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *(undefined4 *)dst_argb = *(undefined4 *)src_argb;
  }
  return;
}

Assistant:

void ScaleARGBColsUp2_C(uint8_t* dst_argb,
                        const uint8_t* src_argb,
                        int dst_width,
                        int x,
                        int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[1] = dst[0] = src[0];
    src += 1;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}